

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O1

bool __thiscall ON_Linetype::RemoveSegment(ON_Linetype *this,int index)

{
  bool bVar1;
  
  if ((this->m_is_locked_bits & 1) == 0) {
    if (index < 0) {
      bVar1 = false;
    }
    else {
      bVar1 = index < (this->m_private->m_segments).m_count;
    }
    if (bVar1 != false) {
      ON_SimpleArray<ON_LinetypeSegment>::Remove(&this->m_private->m_segments,index);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_Linetype::RemoveSegment( int index )
{
  if (PatternIsLocked())
    return false;
  bool rc = ( index >= 0 && index < m_private->m_segments.Count());
  if (rc)
    m_private->m_segments.Remove(index);
  return rc;
}